

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall dh::trival::trival(trival *this,string *operand)

{
  string *operand_local;
  trival *this_local;
  
  trivalitem::trivalitem(&this->_res);
  std::__cxx11::string::string((string *)&this->_operand);
  trivalitem::trivalitem(&this->_val1);
  trivalitem::trivalitem(&this->_val2);
  std::__cxx11::string::operator=((string *)&this->_operand,(string *)operand);
  this->size = 0;
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}